

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::SmallVector
          (SmallVector<unsigned_int,_2UL> *this,initializer_list<unsigned_int> init_list)

{
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> __ptr;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var1;
  ulong uVar2;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  iterator puVar3;
  
  uVar2 = init_list._M_len;
  puVar3 = init_list._M_array;
  this->_vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
  this->size_ = 0;
  this->small_data_ = (uint *)this->buffer;
  (this->large_data_)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  if (uVar2 < 2) {
    if (uVar2 != 0) {
      *(uint *)this->buffer[0].data._M_elems = *puVar3;
      this->size_ = 1;
    }
  }
  else {
    this_00 = &this->large_data_;
    _Var1._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    *(undefined8 *)
     &(_Var1._M_head_impl)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> = 0;
    *(undefined8 *)
     ((long)&(_Var1._M_head_impl)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
     8) = 0;
    *(undefined8 *)
     ((long)&(_Var1._M_head_impl)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
     0x10) = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)_Var1._M_head_impl,puVar3,
               puVar3 + uVar2);
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
         _M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = _Var1._M_head_impl;
    if (__ptr._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 this_00,__ptr._M_head_impl);
      return;
    }
  }
  return;
}

Assistant:

SmallVector(std::initializer_list<T> init_list) : SmallVector() {
    if (init_list.size() < small_size) {
      for (auto it = init_list.begin(); it != init_list.end(); ++it) {
        new (small_data_ + (size_++)) T(std::move(*it));
      }
    } else {
      large_data_ = MakeUnique<std::vector<T>>(std::move(init_list));
    }
  }